

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O1

void __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::DeclarationSyntax*,psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax*>>
::acceptVisitor(CoreSyntaxNodeList<psy::C::DeclarationSyntax*,psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax*>>
                *this)

{
  Action AVar1;
  SyntaxVisitor *in_RSI;
  CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
  *it;
  CoreSyntaxNodeList<psy::C::DeclarationSyntax*,psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax*>>
  *pCVar2;
  
  pCVar2 = this + -0x18;
  while ((*(SyntaxNode **)(pCVar2 + 8) == (SyntaxNode *)0x0 ||
         (AVar1 = SyntaxNode::acceptVisitor(*(SyntaxNode **)(pCVar2 + 8),in_RSI), AVar1 != Quit))) {
    pCVar2 = *(CoreSyntaxNodeList<psy::C::DeclarationSyntax*,psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax*>>
               **)(pCVar2 + 0x10);
    if (pCVar2 == (CoreSyntaxNodeList<psy::C::DeclarationSyntax*,psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax*>>
                   *)0x0) {
      return;
    }
  }
  return;
}

Assistant:

virtual SyntaxVisitor::Action acceptVisitor(SyntaxVisitor* visitor) override
    {
        for (auto it = this; it; it = it->next) {
            SyntaxNodeT node = static_cast<SyntaxNodeT>(it->value);
            if (node) {
                auto action = node->acceptVisitor(visitor);
                if (action == SyntaxVisitor::Action::Quit)
                    return action;
            }
        }
        return SyntaxVisitor::Action::Visit;
    }